

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
          (RepeatedPtrFieldBase *this)

{
  int v1;
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_20;
  
  v1 = this->current_size_;
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(v1,0,"n >= 0");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x130,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
  }
  if (0 < v1) {
    ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
              (this);
    return;
  }
  return;
}

Assistant:

void Clear() {
    const int n = current_size_;
    ABSL_DCHECK_GE(n, 0);
    if (n > 0) {
      using H = CommonHandler<TypeHandler>;
      ClearNonEmpty<H>();
    }
  }